

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 *puVar5;
  undefined1 *puVar6;
  int *piVar7;
  Value *pVVar8;
  unsigned_long *puVar9;
  size_t slen;
  size_t slen_00;
  char *pcVar10;
  char c;
  undefined7 uStack_11f;
  undefined1 local_118 [16];
  BuffFS buff;
  
  buff.pushed = 0;
  buff.blen = 0;
  local_118._8_8_ = L;
  buff.L = L;
  do {
    pcVar4 = strchr(fmt,0x25);
    if (pcVar4 == (char *)0x0) {
      slen_00 = strlen(fmt);
      addstr2buff(&buff,fmt,slen_00);
      clearbuff(&buff);
      return (char *)(*(long *)(((StkIdRel *)(local_118._8_8_ + 0x10))->offset + -0x10) + 0x18);
    }
    addstr2buff(&buff,fmt,(long)pcVar4 - (long)fmt);
    cVar1 = pcVar4[1];
    if (cVar1 == '%') {
      pcVar10 = "%";
LAB_0014153b:
      slen = 1;
LAB_001415f2:
      addstr2buff(&buff,pcVar10,slen);
    }
    else if (cVar1 == 'I') {
      uVar2 = argp->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        pVVar8 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        pVVar8 = (Value *)argp->overflow_arg_area;
        argp->overflow_arg_area = pVVar8 + 1;
      }
      _c = *pVVar8;
LAB_00141608:
      local_118[0] = '\x03';
LAB_00141612:
      addnum2buff(&buff,(TValue *)&c);
    }
    else {
      if (cVar1 == 'U') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar9 = (unsigned_long *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          puVar9 = (unsigned_long *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar9 + 1;
        }
        iVar3 = luaO_utf8esc(&c,*puVar9);
        slen = (size_t)iVar3;
        pcVar10 = local_118 + -slen;
        goto LAB_001415f2;
      }
      if (cVar1 == 'c') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar6 = (undefined1 *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          puVar6 = (undefined1 *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar6 + 8;
        }
        c = *puVar6;
        pcVar10 = &c;
        goto LAB_0014153b;
      }
      if (cVar1 == 'd') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          piVar7 = (int *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          piVar7 = (int *)argp->overflow_arg_area;
          argp->overflow_arg_area = piVar7 + 2;
        }
        _c = (Value)(long)*piVar7;
        goto LAB_00141608;
      }
      if (cVar1 == 'f') {
        uVar2 = argp->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          pVVar8 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->fp_offset = uVar2 + 0x10;
        }
        else {
          pVVar8 = (Value *)argp->overflow_arg_area;
          argp->overflow_arg_area = pVVar8 + 1;
        }
        _c = *pVVar8;
        local_118[0] = '\x13';
        goto LAB_00141612;
      }
      if (cVar1 != 'p') {
        if (cVar1 != 's') {
          luaG_runerror((lua_State *)local_118._8_8_,
                        "invalid option \'%%%c\' to \'lua_pushfstring\'",(ulong)(uint)(int)cVar1);
        }
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar5 = (undefined8 *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          puVar5 = (undefined8 *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar5 + 1;
        }
        pcVar10 = (char *)*puVar5;
        if ((TValue *)pcVar10 == (TValue *)0x0) {
          pcVar10 = "(null)";
        }
        slen = strlen(pcVar10);
        goto LAB_001415f2;
      }
      pcVar10 = getbuff(&buff,0x20);
      uVar2 = argp->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (undefined8 *)argp->overflow_arg_area;
        argp->overflow_arg_area = puVar5 + 1;
      }
      iVar3 = snprintf(pcVar10,0x20,"%p",*puVar5);
      buff.blen = buff.blen + iVar3;
    }
    fmt = pcVar4 + 2;
  } while( true );
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  BuffFS buff;  /* holds last part of the result */
  const char *e;  /* points to next '%' */
  buff.pushed = buff.blen = 0;
  buff.L = L;
  while ((e = strchr(fmt, '%')) != NULL) {
    addstr2buff(&buff, fmt, e - fmt);  /* add 'fmt' up to '%' */
    switch (*(e + 1)) {  /* conversion specifier */
      case 's': {  /* zero-terminated string */
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        addstr2buff(&buff, s, strlen(s));
        break;
      }
      case 'c': {  /* an 'int' as a character */
        char c = cast_uchar(va_arg(argp, int));
        addstr2buff(&buff, &c, sizeof(char));
        break;
      }
      case 'd': {  /* an 'int' */
        TValue num;
        setivalue(&num, va_arg(argp, int));
        addnum2buff(&buff, &num);
        break;
      }
      case 'I': {  /* a 'lua_Integer' */
        TValue num;
        setivalue(&num, cast(lua_Integer, va_arg(argp, l_uacInt)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'f': {  /* a 'lua_Number' */
        TValue num;
        setfltvalue(&num, cast_num(va_arg(argp, l_uacNumber)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'p': {  /* a pointer */
        const int sz = 3 * sizeof(void*) + 8; /* enough space for '%p' */
        char *bf = getbuff(&buff, sz);
        void *p = va_arg(argp, void *);
        int len = lua_pointer2str(bf, sz, p);
        addsize(&buff, len);
        break;
      }
      case 'U': {  /* a 'long' as a UTF-8 sequence */
        char bf[UTF8BUFFSZ];
        int len = luaO_utf8esc(bf, va_arg(argp, long));
        addstr2buff(&buff, bf + UTF8BUFFSZ - len, len);
        break;
      }
      case '%': {
        addstr2buff(&buff, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L, "invalid option '%%%c' to 'lua_pushfstring'",
                         *(e + 1));
      }
    }
    fmt = e + 2;  /* skip '%' and the specifier */
  }
  addstr2buff(&buff, fmt, strlen(fmt));  /* rest of 'fmt' */
  clearbuff(&buff);  /* empty buffer into the stack */
  lua_assert(buff.pushed == 1);
  return getstr(tsvalue(s2v(L->top.p - 1)));
}